

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::writeAttributes(ObjectFile *this,File *objectFile)

{
  bool bVar1;
  uint uVar2;
  ulong extraout_RAX;
  undefined8 uVar3;
  iterator this_00;
  iterator value_00;
  pointer ppVar4;
  __off_t __length;
  File *in_RSI;
  File *__file;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_RDI;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  *value_4;
  unsigned_long osAttrType_4;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value_3;
  unsigned_long osAttrType_3;
  ByteString *value_2;
  unsigned_long osAttrType_2;
  unsigned_long value_1;
  unsigned_long osAttrType_1;
  bool value;
  unsigned_long osAttrType;
  unsigned_long p11AttrType;
  iterator i;
  unsigned_long newGen;
  undefined4 in_stack_00000250;
  undefined4 in_stack_00000254;
  File *in_stack_00000258;
  _Self in_stack_ffffffffffffff70;
  int iVar5;
  File *in_stack_ffffffffffffff78;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff80;
  File *in_stack_ffffffffffffff88;
  _Self in_stack_ffffffffffffffd0;
  _Self in_stack_ffffffffffffffd8;
  bool local_1;
  
  __file = in_RSI;
  Generation::sync(*(Generation **)&in_RDI[1]._M_t._M_impl);
  if ((extraout_RAX & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    softHSMLog(7,"writeAttributes",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x20e,"Failed to synchronize generation number from object %s",uVar3);
    File::unlock(in_stack_ffffffffffffff88);
    local_1 = false;
  }
  else {
    uVar2 = File::truncate(in_RSI,(char *)__file,__length);
    if ((uVar2 & 1) == 0) {
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(7,"writeAttributes",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x217,"Failed to reset object %s",uVar3);
      File::unlock(in_stack_ffffffffffffff88);
      local_1 = false;
    }
    else {
      Generation::update(*(Generation **)&in_RDI[1]._M_t._M_impl);
      Generation::get(*(Generation **)&in_RDI[1]._M_t._M_impl);
      bVar1 = File::writeULong((File *)in_stack_ffffffffffffffd8._M_node,
                               (unsigned_long)in_stack_ffffffffffffffd0._M_node);
      if (bVar1) {
        this_00 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::begin(in_RDI);
        while( true ) {
          iVar5 = (int)((ulong)in_stack_ffffffffffffff70._M_node >> 0x20);
          value_00 = std::
                     map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                     ::end(in_RDI);
          bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,
                                  (_Self *)&stack0xffffffffffffffd0);
          if (!bVar1) break;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                              0x1559d1);
          if (ppVar4->second != (OSAttribute *)0x0) {
            std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)0x1559e7
                      );
            bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node);
            if (!bVar1) {
              uVar3 = std::__cxx11::string::c_str();
              softHSMLog(7,"writeAttributes",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                         ,0x239,"Failed to write PKCS #11 attribute type to object %s",uVar3);
              File::unlock(in_stack_ffffffffffffff88);
              return false;
            }
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *
                                )0x155a5f);
            bVar1 = OSAttribute::isBooleanAttribute(ppVar4->second);
            if (bVar1) {
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                       operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                   *)0x155a84);
              OSAttribute::getBooleanValue(ppVar4->second);
              bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node);
              if ((!bVar1) ||
                 (bVar1 = File::writeBool(in_stack_ffffffffffffff78,SUB41((uint)iVar5 >> 0x18,0)),
                 !bVar1)) {
                uVar3 = std::__cxx11::string::c_str();
                softHSMLog(7,"writeAttributes",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                           ,0x247,"Failed to write attribute to object %s",uVar3);
                File::unlock(in_stack_ffffffffffffff88);
                return false;
              }
            }
            else {
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                       operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                   *)0x155b24);
              bVar1 = OSAttribute::isUnsignedLongAttribute(ppVar4->second);
              if (bVar1) {
                ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                         operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                     *)0x155b49);
                OSAttribute::getUnsignedLongValue(ppVar4->second);
                bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node);
                if ((!bVar1) ||
                   (bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node
                                            ), !bVar1)) {
                  uVar3 = std::__cxx11::string::c_str();
                  softHSMLog(7,"writeAttributes",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                             ,0x255,"Failed to write attribute to object %s",uVar3);
                  File::unlock(in_stack_ffffffffffffff88);
                  return false;
                }
              }
              else {
                ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                         operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                     *)0x155be4);
                bVar1 = OSAttribute::isByteStringAttribute(ppVar4->second);
                if (bVar1) {
                  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                       *)0x155c09);
                  OSAttribute::getByteStringValue(ppVar4->second);
                  bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node);
                  if ((!bVar1) ||
                     (bVar1 = File::writeByteString
                                        ((File *)this_00._M_node,(ByteString *)value_00._M_node),
                     !bVar1)) {
                    uVar3 = std::__cxx11::string::c_str();
                    softHSMLog(7,"writeAttributes",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                               ,0x263,"Failed to write attribute to object %s",uVar3);
                    File::unlock(in_stack_ffffffffffffff88);
                    return false;
                  }
                }
                else {
                  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::
                           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                       *)0x155ca4);
                  bVar1 = OSAttribute::isMechanismTypeSetAttribute(ppVar4->second);
                  if (bVar1) {
                    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                           *)0x155cc9);
                    in_stack_ffffffffffffff88 =
                         (File *)OSAttribute::getMechanismTypeSetValue(ppVar4->second);
                    bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node
                                            );
                    if ((!bVar1) ||
                       (bVar1 = File::writeMechanismTypeSet
                                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
                       !bVar1)) {
                      uVar3 = std::__cxx11::string::c_str();
                      softHSMLog(7,"writeAttributes",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                                 ,0x271,"Failed to write attribute to object %s",uVar3);
                      File::unlock(in_stack_ffffffffffffff88);
                      return false;
                    }
                  }
                  else {
                    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                           *)0x155d64);
                    bVar1 = OSAttribute::isAttributeMapAttribute(ppVar4->second);
                    if (!bVar1) {
                      uVar3 = std::__cxx11::string::c_str();
                      softHSMLog(7,"writeAttributes",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                                 ,0x288,"Unknown attribute type for object %s",uVar3);
                      File::unlock(in_stack_ffffffffffffff88);
                      return false;
                    }
                    in_stack_ffffffffffffff80 =
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x4;
                    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>
                                           *)0x155d89);
                    in_stack_ffffffffffffff78 =
                         (File *)OSAttribute::getAttributeMapValue(ppVar4->second);
                    bVar1 = File::writeULong((File *)this_00._M_node,(unsigned_long)value_00._M_node
                                            );
                    if ((!bVar1) ||
                       (bVar1 = File::writeAttributeMap
                                          (in_stack_00000258,
                                           (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                                            *)CONCAT44(in_stack_00000254,in_stack_00000250)), !bVar1
                       )) {
                      uVar3 = std::__cxx11::string::c_str();
                      softHSMLog(7,"writeAttributes",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                                 ,0x27f,"Failed to write attribute to object %s",uVar3);
                      File::unlock(in_stack_ffffffffffffff88);
                      return false;
                    }
                  }
                }
              }
            }
          }
          in_stack_ffffffffffffff70 =
               std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                          in_stack_ffffffffffffff78,iVar5);
        }
        File::unlock(in_stack_ffffffffffffff88);
        local_1 = true;
      }
      else {
        uVar3 = std::__cxx11::string::c_str();
        softHSMLog(7,"writeAttributes",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x224,"Failed to write new generation number to object %s",uVar3);
        Generation::rollback(*(Generation **)&in_RDI[1]._M_t._M_impl);
        File::unlock(in_stack_ffffffffffffff88);
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ObjectFile::writeAttributes(File &objectFile)
{
	if (!gen->sync(objectFile))
	{
		DEBUG_MSG("Failed to synchronize generation number from object %s", path.c_str());

		objectFile.unlock();

		return false;
	}

	if (!objectFile.truncate())
	{
		DEBUG_MSG("Failed to reset object %s", path.c_str());

		objectFile.unlock();

		return false;
	}

	gen->update();

	unsigned long newGen = gen->get();

	if (!objectFile.writeULong(newGen))
	{
		DEBUG_MSG("Failed to write new generation number to object %s", path.c_str());

		gen->rollback();

		objectFile.unlock();

		return false;
	}


	for (std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator i = attributes.begin(); i != attributes.end(); i++)
	{
		if (i->second == NULL)
		{
			continue;
		}

		unsigned long p11AttrType = i->first;

		if (!objectFile.writeULong(p11AttrType))
		{
			DEBUG_MSG("Failed to write PKCS #11 attribute type to object %s", path.c_str());

			objectFile.unlock();

			return false;
		}

		if (i->second->isBooleanAttribute())
		{
			unsigned long osAttrType = BOOLEAN_ATTR;
			bool value = i->second->getBooleanValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeBool(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isUnsignedLongAttribute())
		{
			unsigned long osAttrType = ULONG_ATTR;
			unsigned long value = i->second->getUnsignedLongValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeULong(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isByteStringAttribute())
		{
			unsigned long osAttrType = BYTESTR_ATTR;
			const ByteString& value = i->second->getByteStringValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeByteString(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isMechanismTypeSetAttribute())
		{
			unsigned long osAttrType = MECHSET_ATTR;
			const std::set<CK_MECHANISM_TYPE>& value = i->second->getMechanismTypeSetValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeMechanismTypeSet(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else if (i->second->isAttributeMapAttribute())
		{
			unsigned long osAttrType = ATTRMAP_ATTR;
			const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value = i->second->getAttributeMapValue();

			if (!objectFile.writeULong(osAttrType) || !objectFile.writeAttributeMap(value))
			{
				DEBUG_MSG("Failed to write attribute to object %s", path.c_str());

				objectFile.unlock();

				return false;
			}
		}
		else
		{
			DEBUG_MSG("Unknown attribute type for object %s", path.c_str());

			objectFile.unlock();

			return false;
		}
	}

	objectFile.unlock();

	return true;
}